

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_warnings_tests.cpp
# Opt level: O0

void __thiscall node_warnings_tests::warnings::test_method(warnings *this)

{
  warning_type id;
  warning_type id_00;
  warning_type id_01;
  warning_type id_02;
  warning_type id_03;
  ConstevalStringLiteral str;
  ConstevalStringLiteral str_00;
  ConstevalStringLiteral str_01;
  ConstevalStringLiteral str_02;
  warning_type id_04;
  warning_type id_05;
  warning_type id_06;
  warning_type id_07;
  bool bVar1;
  Warnings *this_00;
  long in_FS_OFFSET;
  vector<bilingual_str,_std::allocator<bilingual_str>_> messages;
  Warning warning_2;
  Warning warning_1;
  Warnings warnings;
  Warnings *in_stack_fffffffffffff608;
  undefined7 in_stack_fffffffffffff610;
  undefined1 in_stack_fffffffffffff617;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff618;
  undefined7 in_stack_fffffffffffff620;
  undefined1 in_stack_fffffffffffff627;
  bilingual_str *in_stack_fffffffffffff630;
  const_string *msg;
  undefined7 in_stack_fffffffffffff638;
  undefined1 in_stack_fffffffffffff63f;
  lazy_ostream *in_stack_fffffffffffff640;
  undefined7 in_stack_fffffffffffff648;
  undefined1 in_stack_fffffffffffff64f;
  undefined7 in_stack_fffffffffffff658;
  undefined1 in_stack_fffffffffffff65f;
  Warnings *in_stack_fffffffffffff660;
  undefined7 in_stack_fffffffffffff678;
  undefined1 in_stack_fffffffffffff67f;
  const_string local_818 [2];
  lazy_ostream local_7f8 [3];
  assertion_result local_7c0 [2];
  const_string local_788 [2];
  lazy_ostream local_768 [2];
  assertion_result local_748 [2];
  const_string local_710 [2];
  lazy_ostream local_6f0 [2];
  assertion_result local_6d0 [2];
  const_string local_698 [2];
  lazy_ostream local_678 [2];
  assertion_result local_658 [2];
  const_string local_620 [2];
  lazy_ostream local_600 [2];
  assertion_result local_5e0 [2];
  const_string local_5a8 [2];
  lazy_ostream local_588 [2];
  assertion_result local_568 [3];
  const_string local_518 [2];
  lazy_ostream local_4f8 [2];
  assertion_result local_4d8 [2];
  const_string local_4a0 [2];
  lazy_ostream local_480 [2];
  assertion_result local_460 [2];
  const_string local_428 [2];
  lazy_ostream local_408 [2];
  assertion_result local_3e8 [2];
  const_string local_3b0 [2];
  lazy_ostream local_390 [2];
  assertion_result local_370 [2];
  const_string local_338 [2];
  lazy_ostream local_318 [2];
  assertion_result local_2f8 [2];
  const_string local_2c0 [2];
  lazy_ostream local_2a0 [2];
  assertion_result local_280 [2];
  const_string local_248 [2];
  lazy_ostream local_228 [3];
  assertion_result local_1f0 [2];
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::Warnings::Warnings
            ((Warnings *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648));
  local_1ac = 1;
  std::variant<kernel::Warning,node::Warning>::variant<node::Warning,void,void,node::Warning,void>
            ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
             (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
  id.super__Variant_base<kernel::Warning,_node::Warning>.
  super__Move_assign_alias<kernel::Warning,_node::Warning>.
  super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff63f;
  id.super__Variant_base<kernel::Warning,_node::Warning>.
  super__Move_assign_alias<kernel::Warning,_node::Warning>.
  super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
       (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff638;
  id.super__Variant_base<kernel::Warning,_node::Warning>.
  super__Move_assign_alias<kernel::Warning,_node::Warning>.
  super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
       (char)((uint7)in_stack_fffffffffffff638 >> 0x20);
  id.super__Variant_base<kernel::Warning,_node::Warning>.
  super__Move_assign_alias<kernel::Warning,_node::Warning>.
  super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
       (short)((uint7)in_stack_fffffffffffff638 >> 0x28);
  ::node::Warnings::Unset
            ((Warnings *)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),id);
  local_1b0 = 0;
  local_1b4 = 2;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    ::node::Warnings::GetMessages(in_stack_fffffffffffff660);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::size
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f0,local_228,local_248,0x1b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff618);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::variant<kernel::Warning,node::Warning>::
    variant<node::Warning_const&,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
               (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    str.lit._7_1_ = in_stack_fffffffffffff65f;
    str.lit._0_7_ = in_stack_fffffffffffff658;
    ::_(str);
    id_04.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff67f;
    id_04.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
         (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff678;
    id_04.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
         (char)((uint7)in_stack_fffffffffffff678 >> 0x20);
    id_04.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
         (short)((uint7)in_stack_fffffffffffff678 >> 0x28);
    ::node::Warnings::Set
              ((Warnings *)CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),id_04,
               in_stack_fffffffffffff630);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_280,local_2a0,local_2c0,0x1d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::variant<kernel::Warning,node::Warning>::
    variant<node::Warning_const&,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
               (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    str_00.lit._7_1_ = in_stack_fffffffffffff65f;
    str_00.lit._0_7_ = in_stack_fffffffffffff658;
    ::_(str_00);
    id_05.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff67f;
    id_05.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
         (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff678;
    id_05.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
         (char)((uint7)in_stack_fffffffffffff678 >> 0x20);
    id_05.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
         (short)((uint7)in_stack_fffffffffffff678 >> 0x28);
    ::node::Warnings::Set
              ((Warnings *)CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),id_05,
               in_stack_fffffffffffff630);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2f8,local_318,local_338,0x1e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::variant<kernel::Warning,node::Warning>::
    variant<node::Warning_const&,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
               (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    id_00.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff63f;
    id_00.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
         (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff638;
    id_00.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
         (char)((uint7)in_stack_fffffffffffff638 >> 0x20);
    id_00.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
         (short)((uint7)in_stack_fffffffffffff638 >> 0x28);
    ::node::Warnings::Unset
              ((Warnings *)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),id_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_370,local_390,local_3b0,0x20,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::variant<kernel::Warning,node::Warning>::
    variant<node::Warning_const&,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
               (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    id_01.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff63f;
    id_01.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
         (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff638;
    id_01.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
         (char)((uint7)in_stack_fffffffffffff638 >> 0x20);
    id_01.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
         (short)((uint7)in_stack_fffffffffffff638 >> 0x28);
    ::node::Warnings::Unset
              ((Warnings *)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),id_01);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3e8,local_408,local_428,0x22,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::variant<kernel::Warning,node::Warning>::
    variant<node::Warning_const&,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
               (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    str_01.lit._7_1_ = in_stack_fffffffffffff65f;
    str_01.lit._0_7_ = in_stack_fffffffffffff658;
    ::_(str_01);
    id_06.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff67f;
    id_06.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
         (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff678;
    id_06.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
         (char)((uint7)in_stack_fffffffffffff678 >> 0x20);
    id_06.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
         (short)((uint7)in_stack_fffffffffffff678 >> 0x28);
    ::node::Warnings::Set
              ((Warnings *)CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),id_06,
               in_stack_fffffffffffff630);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_460,local_480,local_4a0,0x24,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::variant<kernel::Warning,node::Warning>::
    variant<node::Warning_const&,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
               (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    str_02.lit._7_1_ = in_stack_fffffffffffff65f;
    str_02.lit._0_7_ = in_stack_fffffffffffff658;
    ::_(str_02);
    id_07.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff67f;
    id_07.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
         (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff678;
    id_07.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
         (char)((uint7)in_stack_fffffffffffff678 >> 0x20);
    id_07.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
         (short)((uint7)in_stack_fffffffffffff678 >> 0x28);
    ::node::Warnings::Set
              ((Warnings *)CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),id_07,
               in_stack_fffffffffffff630);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4d8,local_4f8,local_518,0x26,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ::node::Warnings::GetMessages(in_stack_fffffffffffff660);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::size
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_568,local_588,local_5a8,0x2a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::operator[]
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff618,
               CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    std::operator==(in_stack_fffffffffffff618,
                    (char *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5e0,local_600,local_620,0x2b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::operator[]
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff618,
               CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    std::operator==(in_stack_fffffffffffff618,
                    (char *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_658,local_678,local_698,0x2c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::variant<kernel::Warning,node::Warning>::
    variant<node::Warning_const&,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
               (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    id_02.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff63f;
    id_02.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
         (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff638;
    id_02.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
         (char)((uint7)in_stack_fffffffffffff638 >> 0x20);
    id_02.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
         (short)((uint7)in_stack_fffffffffffff638 >> 0x28);
    ::node::Warnings::Unset
              ((Warnings *)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),id_02);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    this_00 = (Warnings *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6d0,local_6f0,local_710,0x2f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),
               (const_string *)in_stack_fffffffffffff630);
    std::variant<kernel::Warning,node::Warning>::
    variant<node::Warning_const&,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffff618,
               (Warning *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
    id_03.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._7_1_ = in_stack_fffffffffffff63f;
    id_03.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_u =
         (_Variadic_union<kernel::Warning,_node::Warning>)(int)in_stack_fffffffffffff638;
    id_03.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._M_index =
         (char)((uint7)in_stack_fffffffffffff638 >> 0x20);
    id_03.super__Variant_base<kernel::Warning,_node::Warning>.
    super__Move_assign_alias<kernel::Warning,_node::Warning>.
    super__Copy_assign_alias<kernel::Warning,_node::Warning>.
    super__Move_ctor_alias<kernel::Warning,_node::Warning>.
    super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
    super__Variant_storage_alias<kernel::Warning,_node::Warning>._5_2_ =
         (short)((uint7)in_stack_fffffffffffff638 >> 0x28);
    in_stack_fffffffffffff64f =
         ::node::Warnings::Unset
                   ((Warnings *)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),id_03)
    ;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    in_stack_fffffffffffff640 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_748,local_768,local_788,0x30,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    in_stack_fffffffffffff63f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff63f);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
               (const_string *)in_stack_fffffffffffff640,
               CONCAT17(in_stack_fffffffffffff63f,in_stack_fffffffffffff638),msg);
    ::node::Warnings::GetMessages(this_00);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::size
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff618,(bool)in_stack_fffffffffffff617);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (basic_cstring<const_char> *)in_stack_fffffffffffff608);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
               (pointer)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (unsigned_long)in_stack_fffffffffffff608);
    in_stack_fffffffffffff608 = (Warnings *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7c0,local_7f8,local_818,0x31,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff608);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff608);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff618);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffff618);
  ::node::Warnings::~Warnings(in_stack_fffffffffffff608);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(warnings)
{
    node::Warnings warnings;
    // On pre-release builds, a warning is generated automatically
    warnings.Unset(node::Warning::PRE_RELEASE_TEST_BUILD);

    // For these tests, we don't care what the exact warnings are, so
    // just refer to them as warning_1 and warning_2
    const auto warning_1{node::Warning::CLOCK_OUT_OF_SYNC};
    const auto warning_2{node::Warning::FATAL_INTERNAL_ERROR};

    // Ensure we start without any warnings
    BOOST_CHECK(warnings.GetMessages().size() == 0);
    // Add two warnings
    BOOST_CHECK(warnings.Set(warning_1, _("warning 1")));
    BOOST_CHECK(warnings.Set(warning_2, _("warning 2")));
    // Unset the second one
    BOOST_CHECK(warnings.Unset(warning_2));
    // Since it's already been unset, this should return false
    BOOST_CHECK(!warnings.Unset(warning_2));
    // We should now be able to set w2 again
    BOOST_CHECK(warnings.Set(warning_2, _("warning 2 - revision 1")));
    // Setting w2 again should return false since it's already set
    BOOST_CHECK(!warnings.Set(warning_2, _("warning 2 - revision 2")));

    // Verify messages are correct
    const auto messages{warnings.GetMessages()};
    BOOST_CHECK(messages.size() == 2);
    BOOST_CHECK(messages[0].original == "warning 1");
    BOOST_CHECK(messages[1].original == "warning 2 - revision 1");

    // Clearing all warnings should also clear all messages
    BOOST_CHECK(warnings.Unset(warning_1));
    BOOST_CHECK(warnings.Unset(warning_2));
    BOOST_CHECK(warnings.GetMessages().size() == 0);
}